

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_rotr_i32_sparc64
               (TCGContext_conflict8 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_rotr_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_rotr_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_rot_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_rotr_i32, ret, arg1, arg2);
    } else {
        TCGv_i32 t0, t1;

        t0 = tcg_temp_new_i32(tcg_ctx);
        t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_shr_i32(tcg_ctx, t0, arg1, arg2);
        tcg_gen_subfi_i32(tcg_ctx, t1, 32, arg2);
        tcg_gen_shl_i32(tcg_ctx, t1, arg1, t1);
        tcg_gen_or_i32(tcg_ctx, ret, t0, t1);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
    }
}